

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void set_snode_merge(lyxp_set *set1,lyxp_set *set2)

{
  lyxp_set_nodes *plVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  lyxp_node_type lVar5;
  lyxp_set_type lVar6;
  undefined4 uVar7;
  uint uVar8;
  lyxp_set_nodes *plVar9;
  LY_ERR *pLVar10;
  ulong uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  
  if ((set1->type & ~LYXP_SET_SNODE_SET) != LYXP_SET_EMPTY) {
LAB_00168d2d:
    __assert_fail("((set1->type == LYXP_SET_SNODE_SET) || (set1->type == LYXP_SET_EMPTY)) && ((set2->type == LYXP_SET_SNODE_SET) || (set2->type == LYXP_SET_EMPTY))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                  ,0x341,"void set_snode_merge(struct lyxp_set *, struct lyxp_set *)");
  }
  if (set2->type != LYXP_SET_EMPTY) {
    if (set2->type != LYXP_SET_SNODE_SET) goto LAB_00168d2d;
    if (set1->type == LYXP_SET_EMPTY) {
      lVar6 = set2->type;
      uVar7 = *(undefined4 *)&set2->field_0x4;
      uVar3 = *(undefined8 *)&set2->field_0x8;
      plVar9 = (set2->val).nodes;
      uVar4 = *(undefined8 *)((long)&set2->val + 8);
      uVar2 = set2->size;
      uVar13 = set2->ctx_pos;
      uVar12 = set2->ctx_size;
      set1->used = set2->used;
      set1->size = uVar2;
      set1->ctx_pos = uVar13;
      set1->ctx_size = uVar12;
      (set1->val).nodes = plVar9;
      *(undefined8 *)((long)&set1->val + 8) = uVar4;
      set1->type = lVar6;
      *(undefined4 *)&set1->field_0x4 = uVar7;
      *(undefined8 *)&set1->field_0x8 = uVar3;
    }
    else {
      uVar8 = set2->used + set1->used;
      if (set1->size < uVar8) {
        set1->size = uVar8;
        plVar9 = (lyxp_set_nodes *)ly_realloc((set1->val).nodes,(ulong)uVar8 << 4);
        (set1->val).nodes = plVar9;
        if (plVar9 == (lyxp_set_nodes *)0x0) {
          pLVar10 = ly_errno_location();
          *pLVar10 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","set_snode_merge");
          return;
        }
      }
      if (set2->used != 0) {
        uVar2 = set1->used;
        uVar11 = 0;
        do {
          uVar13 = 0;
          if (uVar2 != 0) {
            plVar9 = (set1->val).nodes;
            uVar12 = 0;
            do {
              uVar13 = uVar12;
              if (plVar9->node == (set2->val).nodes[uVar11].node) break;
              uVar12 = uVar12 + 1;
              plVar9 = plVar9 + 1;
              uVar13 = uVar2;
            } while (uVar2 != uVar12);
          }
          if (uVar13 == uVar2) {
            plVar9 = (set2->val).nodes + uVar11;
            lVar5 = plVar9->type;
            uVar13 = plVar9->pos;
            plVar1 = (set1->val).nodes + set1->used;
            plVar1->node = plVar9->node;
            plVar1->type = lVar5;
            plVar1->pos = uVar13;
            set1->used = set1->used + 1;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < set2->used);
      }
      free((set2->val).nodes);
      set2->used = 0;
      set2->size = 0;
      set2->ctx_pos = 0;
      set2->ctx_size = 0;
      (set2->val).nodes = (lyxp_set_nodes *)0x0;
      *(undefined8 *)((long)&set2->val + 8) = 0;
      *(undefined8 *)set2 = 0;
      *(undefined8 *)&set2->field_0x8 = 0;
    }
  }
  return;
}

Assistant:

static void
set_snode_merge(struct lyxp_set *set1, struct lyxp_set *set2)
{
    uint32_t orig_used, i, j;

    assert(((set1->type == LYXP_SET_SNODE_SET) || (set1->type == LYXP_SET_EMPTY))
        && ((set2->type == LYXP_SET_SNODE_SET) || (set2->type == LYXP_SET_EMPTY)));

    if (set2->type == LYXP_SET_EMPTY) {
        return;
    }

    if (set1->type == LYXP_SET_EMPTY) {
        memcpy(set1, set2, sizeof *set1);
        return;
    }

    if (set1->used + set2->used > set1->size) {
        set1->size = set1->used + set2->used;
        set1->val.snodes = ly_realloc(set1->val.snodes, set1->size * sizeof *set1->val.snodes);
        if (!set1->val.snodes) {
            LOGMEM;
            return;
        }
    }

    orig_used = set1->used;

    for (i = 0; i < set2->used; ++i) {
        for (j = 0; j < orig_used; ++j) {
            /* detect duplicities */
            if (set1->val.snodes[j].snode == set2->val.snodes[i].snode) {
                break;
            }
        }

        if (j == orig_used) {
            memcpy(&set1->val.snodes[set1->used], &set2->val.snodes[i], sizeof *set2->val.snodes);
            ++set1->used;
        }
    }

    free(set2->val.snodes);
    memset(set2, 0, sizeof *set2);
}